

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib652.c
# Opt level: O3

int test(char *URL)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  ushort uVar6;
  long lVar7;
  
  cVar1 = 'A';
  lVar4 = 0;
  uVar6 = 0;
  do {
    lVar7 = (ulong)(byte)(cVar1 + (char)(uVar6 / 0x1a) * -0x1a) * 0x101010101010101;
    *(long *)(buffer + lVar4) = lVar7;
    *(short *)(buffer + lVar4 + 8) = (short)lVar7;
    cVar1 = cVar1 + '\x01';
    uVar6 = uVar6 + 1;
    lVar4 = lVar4 + 10;
  } while (lVar4 != 17000);
  iVar2 = curl_global_init(3);
  if (iVar2 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    pcVar5 = "curl_easy_init() failed\n";
LAB_00101380:
    lVar7 = 0;
    curl_mfprintf(_stderr,pcVar5);
    iVar2 = 0x7e;
  }
  else {
    lVar7 = curl_mime_init(lVar4);
    if (lVar7 == 0) {
      pcVar5 = "curl_mime_init() failed\n";
      goto LAB_00101380;
    }
    lVar3 = curl_mime_addpart(lVar7);
    if (lVar3 == 0) {
      lVar3 = 0;
      curl_mfprintf(_stderr,"curl_mime_addpart() failed\n");
      iVar2 = 0x7e;
      goto LAB_00101446;
    }
    iVar2 = curl_mime_filename(lVar3,"myfile.jpg");
    if (iVar2 != 0) {
      pcVar5 = "curl_mime_filename() failed\n";
LAB_0010143c:
      lVar3 = 0;
      curl_mfprintf(_stderr,pcVar5);
      goto LAB_00101446;
    }
    iVar2 = curl_mime_type(lVar3,"image/jpeg");
    if (iVar2 != 0) {
      pcVar5 = "curl_mime_type() failed\n";
      goto LAB_0010143c;
    }
    iVar2 = curl_mime_data(lVar3,buffer,17000);
    if (iVar2 != 0) {
      pcVar5 = "curl_mime_data() failed\n";
      goto LAB_0010143c;
    }
    iVar2 = curl_mime_encoder(lVar3,"base64");
    if (iVar2 != 0) {
      pcVar5 = "curl_mime_encoder() failed\n";
      goto LAB_0010143c;
    }
    iVar2 = 0;
    lVar3 = curl_slist_append(0,"someone@example.com");
    if (lVar3 != 0) {
      iVar2 = curl_easy_setopt(lVar4,0x2712,URL);
      if ((((iVar2 == 0) &&
           (iVar2 = curl_easy_setopt(lVar4,0x27ca,"somebody@example.com"), iVar2 == 0)) &&
          (iVar2 = curl_easy_setopt(lVar4,0x27cb,lVar3), iVar2 == 0)) &&
         ((iVar2 = curl_easy_setopt(lVar4,0x281d,lVar7), iVar2 == 0 &&
          (iVar2 = curl_easy_setopt(lVar4,0x29,1), iVar2 == 0)))) {
        iVar2 = curl_easy_perform(lVar4);
      }
      goto LAB_00101446;
    }
    curl_mfprintf(_stderr,"curl_slist_append() failed\n");
  }
  lVar3 = 0;
LAB_00101446:
  curl_easy_cleanup(lVar4);
  curl_mime_free(lVar7);
  curl_slist_free_all(lVar3);
  curl_global_cleanup();
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURL *curl = NULL;
  CURLcode res = CURLE_OK;
  curl_mime *mime = NULL;
  curl_mimepart *part;
  struct curl_slist *recipients = NULL;

  /* create a buffer with AAAA...BBBBB...CCCC...etc */
  int i;
  int size = (int)sizeof(buffer) / 10;

  for(i = 0; i < size ; i++)
    memset(&buffer[i * 10], 65 + (i % 26), 10);

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  /* Build mime structure. */
  mime = curl_mime_init(curl);
  if(!mime) {
    fprintf(stderr, "curl_mime_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  res = curl_mime_filename(part, "myfile.jpg");
  if(res) {
    fprintf(stderr, "curl_mime_filename() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_type(part, "image/jpeg");
  if(res) {
    fprintf(stderr, "curl_mime_type() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_data(part, buffer, sizeof(buffer));
  if(res) {
    fprintf(stderr, "curl_mime_data() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_encoder(part, "base64");
  if(res) {
    fprintf(stderr, "curl_mime_encoder() failed\n");
    goto test_cleanup;
  }

  /* Prepare recipients. */
  recipients = curl_slist_append(NULL, "someone@example.com");
  if(!recipients) {
    fprintf(stderr, "curl_slist_append() failed\n");
    goto test_cleanup;
  }

  /* First set the URL that is about to receive our mime mail. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Set sender. */
  test_setopt(curl, CURLOPT_MAIL_FROM, "somebody@example.com");

  /* Set recipients. */
  test_setopt(curl, CURLOPT_MAIL_RCPT, recipients);

  /* send a multi-part mail */
  test_setopt(curl, CURLOPT_MIMEPOST, mime);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the mime structure */
  curl_mime_free(mime);

  /* cleanup the recipients. */
  curl_slist_free_all(recipients);

  curl_global_cleanup();

  return res;
}